

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Array<unsigned_char> * __thiscall
kj::anon_unknown_9::DiskHandle::mmapPrivate
          (Array<unsigned_char> *__return_storage_ptr__,DiskHandle *this,uint64_t offset,
          uint64_t size)

{
  int __fd;
  int *piVar1;
  MmapRange MVar2;
  Fault local_48;
  Fault f;
  void *mapping;
  MmapRange range;
  uint64_t size_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  
  if (size == 0) {
    Array<unsigned_char>::Array(__return_storage_ptr__,(void *)0x0);
  }
  else {
    MVar2 = getMmapRange(offset,size);
    range.offset = MVar2.size;
    __fd = OwnFd::operator_cast_to_int(&this->fd);
    mapping = (void *)MVar2.offset;
    f.exception = (Exception *)mmap64((void *)0x0,range.offset,3,2,__fd,(__off64_t)mapping);
    if (f.exception == (Exception *)0xffffffffffffffff) {
      piVar1 = __errno_location();
      _::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x178,*piVar1,"mmap","");
      _::Debug::Fault::fatal(&local_48);
    }
    Array<unsigned_char>::Array
              (__return_storage_ptr__,(uchar *)((long)f.exception + (offset - (long)mapping)),size,
               (ArrayDisposer *)&(anonymous_namespace)::mmapDisposer);
  }
  return __return_storage_ptr__;
}

Assistant:

Array<byte> mmapPrivate(uint64_t offset, uint64_t size) const {
    if (size == 0) return nullptr;  // zero-length mmap() returns EINVAL, so avoid it
    auto range = getMmapRange(offset, size);
    void* mapping = ::mmap(NULL, range.size, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<byte>(reinterpret_cast<byte*>(mapping) + (offset - range.offset),
                       size, mmapDisposer);
  }